

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineRenderToImageTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)17>_> *
vkt::pipeline::anon_unknown_0::makeRenderPass
          (Move<vk::Handle<(vk::HandleType)17>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkFormat colorFormat,VkFormat depthStencilFormat,deUint32 numLayers,
          VkImageLayout initialColorImageLayout,VkImageLayout initialDepthStencilImageLayout)

{
  allocator<vk::VkAttachmentReference> *paVar1;
  value_type vVar2;
  value_type vVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  reference pvVar6;
  size_type sVar7;
  undefined1 local_1b8 [8];
  VkRenderPassCreateInfo renderPassInfo;
  VkSubpassDescription subpassDescription;
  VkAttachmentReference *pDepthStencilAttachment;
  VkAttachmentReference depthStencilAttachmentRef;
  VkAttachmentReference attachmentRef;
  deUint32 i;
  vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> subpasses;
  undefined1 local_f0 [8];
  vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
  depthStencilAttachmentReferences;
  undefined1 local_d0 [8];
  vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
  colorAttachmentReferences;
  __normal_iterator<vk::VkAttachmentDescription_*,_std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>_>
  local_b0;
  const_iterator local_a8;
  undefined1 local_a0 [8];
  VkAttachmentDescription depthStencilAttachmentDescription;
  allocator<vk::VkAttachmentDescription> local_69;
  undefined1 local_68 [8];
  vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
  attachmentDescriptions;
  VkAttachmentDescription colorAttachmentDescription;
  deUint32 numLayers_local;
  VkFormat depthStencilFormat_local;
  VkFormat colorFormat_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  
  attachmentDescriptions.
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  attachmentDescriptions.
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = colorFormat;
  std::allocator<vk::VkAttachmentDescription>::allocator(&local_69);
  std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::vector
            ((vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_> *)
             local_68,(ulong)numLayers,
             (value_type *)
             &attachmentDescriptions.
              super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_69);
  std::allocator<vk::VkAttachmentDescription>::~allocator(&local_69);
  local_a0._0_4_ = 0;
  depthStencilAttachmentDescription.flags = 1;
  depthStencilAttachmentDescription.format = VK_FORMAT_R4G4_UNORM_PACK8;
  depthStencilAttachmentDescription.samples = VK_SAMPLE_COUNT_1_BIT;
  depthStencilAttachmentDescription.loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
  depthStencilAttachmentDescription.storeOp = VK_ATTACHMENT_STORE_OP_DONT_CARE;
  depthStencilAttachmentDescription.stencilLoadOp = initialDepthStencilImageLayout;
  depthStencilAttachmentDescription.stencilStoreOp =
       VK_ATTACHMENT_STORE_OP_LAST|VK_ATTACHMENT_STORE_OP_DONT_CARE;
  local_a0._4_4_ = depthStencilFormat;
  if (depthStencilFormat != VK_FORMAT_UNDEFINED) {
    local_b0._M_current =
         (VkAttachmentDescription *)
         std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::end
                   ((vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                     *)local_68);
    __gnu_cxx::
    __normal_iterator<vk::VkAttachmentDescription_const*,std::vector<vk::VkAttachmentDescription,std::allocator<vk::VkAttachmentDescription>>>
    ::__normal_iterator<vk::VkAttachmentDescription*>
              ((__normal_iterator<vk::VkAttachmentDescription_const*,std::vector<vk::VkAttachmentDescription,std::allocator<vk::VkAttachmentDescription>>>
                *)&local_a8,&local_b0);
    colorAttachmentReferences.
    super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                  ::insert((vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                            *)local_68,local_a8,(ulong)numLayers,(value_type *)local_a0);
  }
  paVar1 = (allocator<vk::VkAttachmentReference> *)
           ((long)&depthStencilAttachmentReferences.
                   super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<vk::VkAttachmentReference>::allocator(paVar1);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::vector
            ((vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_> *)
             local_d0,(ulong)numLayers,paVar1);
  std::allocator<vk::VkAttachmentReference>::~allocator
            ((allocator<vk::VkAttachmentReference> *)
             ((long)&depthStencilAttachmentReferences.
                     super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  paVar1 = (allocator<vk::VkAttachmentReference> *)
           ((long)&subpasses.
                   super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<vk::VkAttachmentReference>::allocator(paVar1);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::vector
            ((vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_> *)
             local_f0,(ulong)numLayers,paVar1);
  std::allocator<vk::VkAttachmentReference>::~allocator
            ((allocator<vk::VkAttachmentReference> *)
             ((long)&subpasses.
                     super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>::vector
            ((vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> *)
             &attachmentRef.layout);
  for (attachmentRef.attachment = 0; dVar4 = attachmentRef.attachment,
      attachmentRef.attachment < numLayers; attachmentRef.attachment = attachmentRef.attachment + 1)
  {
    dVar5 = attachmentRef.attachment + numLayers;
    pvVar6 = std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::
             operator[]((vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                         *)local_d0,(ulong)attachmentRef.attachment);
    vVar3.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
    vVar3.attachment = dVar4;
    *pvVar6 = vVar3;
    pvVar6 = std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::
             operator[]((vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                         *)local_f0,(ulong)attachmentRef.attachment);
    vVar2.layout = VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL;
    vVar2.attachment = dVar5;
    *pvVar6 = vVar2;
    if (depthStencilFormat != VK_FORMAT_UNDEFINED) {
      std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::operator[]
                ((vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_> *)
                 local_f0,(ulong)attachmentRef.attachment);
    }
    renderPassInfo.pDependencies._0_4_ = 0;
    renderPassInfo.pDependencies._4_4_ = 0;
    std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::operator[]
              ((vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_> *)
               local_d0,(ulong)attachmentRef.attachment);
    std::vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>::push_back
              ((vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> *)
               &attachmentRef.layout,(value_type *)&renderPassInfo.pDependencies);
  }
  local_1b8._0_4_ = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  renderPassInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassInfo._4_4_ = 0;
  renderPassInfo.pNext._0_4_ = 0;
  sVar7 = std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::
          size((vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_> *)
               local_68);
  renderPassInfo.pNext._4_4_ = (undefined4)sVar7;
  renderPassInfo._16_8_ =
       std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::
       operator[]((vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                   *)local_68,0);
  sVar7 = std::vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>::size
                    ((vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> *)
                     &attachmentRef.layout);
  renderPassInfo.pAttachments._0_4_ = (undefined4)sVar7;
  renderPassInfo._32_8_ =
       std::vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>::operator[]
                 ((vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> *)
                  &attachmentRef.layout,0);
  renderPassInfo.pSubpasses._0_4_ = 0;
  renderPassInfo.dependencyCount = 0;
  renderPassInfo._52_4_ = 0;
  ::vk::createRenderPass
            (__return_storage_ptr__,vk,device,(VkRenderPassCreateInfo *)local_1b8,
             (VkAllocationCallbacks *)0x0);
  std::vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>::~vector
            ((vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> *)
             &attachmentRef.layout);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::~vector
            ((vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_> *)
             local_f0);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::~vector
            ((vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_> *)
             local_d0);
  std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::~vector
            ((vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_> *)
             local_68);
  return __return_storage_ptr__;
}

Assistant:

Move<VkRenderPass> makeRenderPass (const DeviceInterface&		vk,
								   const VkDevice				device,
								   const VkFormat				colorFormat,
								   const VkFormat				depthStencilFormat,
								   const deUint32				numLayers,
								   const VkImageLayout			initialColorImageLayout			= VK_IMAGE_LAYOUT_UNDEFINED,
								   const VkImageLayout			initialDepthStencilImageLayout	= VK_IMAGE_LAYOUT_UNDEFINED)
{
	const VkAttachmentDescription colorAttachmentDescription =
	{
		(VkAttachmentDescriptionFlags)0,					// VkAttachmentDescriptionFlags		flags;
		colorFormat,										// VkFormat							format;
		VK_SAMPLE_COUNT_1_BIT,								// VkSampleCountFlagBits			samples;
		VK_ATTACHMENT_LOAD_OP_CLEAR,						// VkAttachmentLoadOp				loadOp;
		VK_ATTACHMENT_STORE_OP_STORE,						// VkAttachmentStoreOp				storeOp;
		VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// VkAttachmentLoadOp				stencilLoadOp;
		VK_ATTACHMENT_STORE_OP_DONT_CARE,					// VkAttachmentStoreOp				stencilStoreOp;
		initialColorImageLayout,							// VkImageLayout					initialLayout;
		VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,			// VkImageLayout					finalLayout;
	};
	vector<VkAttachmentDescription> attachmentDescriptions(numLayers, colorAttachmentDescription);

	const VkAttachmentDescription depthStencilAttachmentDescription =
	{
		(VkAttachmentDescriptionFlags)0,					// VkAttachmentDescriptionFlags		flags;
		depthStencilFormat,									// VkFormat							format;
		VK_SAMPLE_COUNT_1_BIT,								// VkSampleCountFlagBits			samples;
		VK_ATTACHMENT_LOAD_OP_CLEAR,						// VkAttachmentLoadOp				loadOp;
		VK_ATTACHMENT_STORE_OP_DONT_CARE,					// VkAttachmentStoreOp				storeOp;
		VK_ATTACHMENT_LOAD_OP_CLEAR,						// VkAttachmentLoadOp				stencilLoadOp;
		VK_ATTACHMENT_STORE_OP_DONT_CARE,					// VkAttachmentStoreOp				stencilStoreOp;
		initialDepthStencilImageLayout,						// VkImageLayout					initialLayout;
		VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,	// VkImageLayout					finalLayout;
	};

	if (depthStencilFormat != VK_FORMAT_UNDEFINED)
		attachmentDescriptions.insert(attachmentDescriptions.end(), numLayers, depthStencilAttachmentDescription);

	// Create a subpass for each attachment (each attachement is a layer of an arrayed image).
	vector<VkAttachmentReference>	colorAttachmentReferences		(numLayers);
	vector<VkAttachmentReference>	depthStencilAttachmentReferences(numLayers);
	vector<VkSubpassDescription>	subpasses;

	// Ordering here must match the framebuffer attachments
	for (deUint32 i = 0; i < numLayers; ++i)
	{
		const VkAttachmentReference attachmentRef =
		{
			i,													// deUint32			attachment;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL			// VkImageLayout	layout;
		};
		const VkAttachmentReference depthStencilAttachmentRef =
		{
			i + numLayers,										// deUint32			attachment;
			VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL	// VkImageLayout	layout;
		};

		colorAttachmentReferences[i]		= attachmentRef;
		depthStencilAttachmentReferences[i]	= depthStencilAttachmentRef;

		const VkAttachmentReference*	pDepthStencilAttachment	= (depthStencilFormat != VK_FORMAT_UNDEFINED ? &depthStencilAttachmentReferences[i] : DE_NULL);
		const VkSubpassDescription		subpassDescription		=
		{
			(VkSubpassDescriptionFlags)0,					// VkSubpassDescriptionFlags		flags;
			VK_PIPELINE_BIND_POINT_GRAPHICS,				// VkPipelineBindPoint				pipelineBindPoint;
			0u,												// deUint32							inputAttachmentCount;
			DE_NULL,										// const VkAttachmentReference*		pInputAttachments;
			1u,												// deUint32							colorAttachmentCount;
			&colorAttachmentReferences[i],					// const VkAttachmentReference*		pColorAttachments;
			DE_NULL,										// const VkAttachmentReference*		pResolveAttachments;
			pDepthStencilAttachment,						// const VkAttachmentReference*		pDepthStencilAttachment;
			0u,												// deUint32							preserveAttachmentCount;
			DE_NULL											// const deUint32*					pPreserveAttachments;
		};
		subpasses.push_back(subpassDescription);
	}

	const VkRenderPassCreateInfo renderPassInfo =
	{
		VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,				// VkStructureType					sType;
		DE_NULL,												// const void*						pNext;
		(VkRenderPassCreateFlags)0,								// VkRenderPassCreateFlags			flags;
		static_cast<deUint32>(attachmentDescriptions.size()),	// deUint32							attachmentCount;
		&attachmentDescriptions[0],								// const VkAttachmentDescription*	pAttachments;
		static_cast<deUint32>(subpasses.size()),				// deUint32							subpassCount;
		&subpasses[0],											// const VkSubpassDescription*		pSubpasses;
		0u,														// deUint32							dependencyCount;
		DE_NULL													// const VkSubpassDependency*		pDependencies;
	};

	return createRenderPass(vk, device, &renderPassInfo);
}